

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstral_analysis.h
# Opt level: O2

void __thiscall sptk::MelGeneralizedCepstralAnalysis::Buffer::~Buffer(Buffer *this)

{
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_0011e260;
  MelCepstralAnalysis::Buffer::~Buffer(&this->buffer_for_mel_cepstral_analysis_);
  MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer::~Buffer
            (&this->buffer_for_mel_generalized_cepstrum_transform_);
  ToeplitzPlusHankelSystemSolver::Buffer::~Buffer(&this->buffer_for_system_solver_);
  RealValuedInverseFastFourierTransform::Buffer::~Buffer
            (&this->buffer_for_inverse_fourier_transform_);
  RealValuedFastFourierTransform::Buffer::~Buffer(&this->buffer_for_fourier_transform_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->gradient_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->periodogram_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->buffer_for_frequency_transform_).
              super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->r_trim_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->r_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->r_imag_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->r_real_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->q_trim_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->q_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->q_imag_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->q_real_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->p_trim_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->p_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->p_real_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->imag_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->real_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->c_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->b_).super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

virtual ~Buffer() {
    }